

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

bool __thiscall FIX::DataDictionary::isMsgField(DataDictionary *this,string *msgType,int field)

{
  const_iterator cVar1;
  const_iterator cVar2;
  bool bVar3;
  key_type local_14;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::find(&(this->m_messageFields)._M_t,msgType);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->m_messageFields)._M_t._M_impl.super__Rb_tree_header) {
    bVar3 = false;
  }
  else {
    cVar2 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (cVar1._M_node + 2,&local_14);
    bVar3 = cVar2._M_node != (_Base_ptr)&cVar1._M_node[2]._M_parent;
  }
  return bVar3;
}

Assistant:

bool isMsgField( const std::string& msgType, int field ) const
  {
    MsgTypeToField::const_iterator i = m_messageFields.find( msgType );
    if ( i == m_messageFields.end() ) return false;
    return i->second.find( field ) != i->second.end();
  }